

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

bool __thiscall
cfd::TransactionContext::VerifyInputSchnorrSignature
          (TransactionContext *this,SchnorrSignature *signature,OutPoint *outpoint,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxo_list,SchnorrPubkey *pubkey,
          ByteData *annex)

{
  pointer pUVar1;
  TransactionContext *this_00;
  SchnorrSignature *signature_00;
  SchnorrPubkey *this_01;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  CfdException *pCVar6;
  pointer utxo;
  AbstractTxIn *this_02;
  ByteData256 sighash;
  ByteData hash;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxos;
  UtxoData target_utxo;
  undefined1 local_600 [56];
  OutPoint *local_5c8;
  TransactionContext *local_5c0;
  SchnorrSignature *local_5b8;
  SchnorrPubkey *local_5b0;
  ByteData *local_5a8;
  AbstractTxIn *local_5a0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_598;
  OutPoint local_590;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> local_568;
  ByteData local_548;
  undefined1 local_52c [92];
  Script local_4d0 [9];
  Amount local_2c8 [41];
  
  local_5c8 = outpoint;
  local_598 = utxo_list;
  UtxoData::UtxoData((UtxoData *)(local_52c + 0xc));
  local_568.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_568.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_568.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::reserve
            (&local_568,
             ((long)(this->super_Transaction).vin_.
                    super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->super_Transaction).vin_.
                    super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7);
  this_02 = &((this->super_Transaction).vin_.
              super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->super_AbstractTxIn;
  local_5a0 = &((this->super_Transaction).vin_.
                super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_AbstractTxIn;
  local_5c0 = this;
  local_5b8 = signature;
  local_5b0 = pubkey;
  if (this_02 != local_5a0) {
    local_5a8 = annex;
    do {
      core::AbstractTxIn::GetTxid((Txid *)local_600,this_02);
      uVar4 = core::AbstractTxIn::GetVout(this_02);
      core::OutPoint::OutPoint(&local_590,(Txid *)local_600,uVar4);
      local_600._0_8_ = &PTR__Txid_00735400;
      if ((pointer)local_600._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_600._8_8_);
      }
      utxo = (local_598->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
             super__Vector_impl_data._M_start;
      pUVar1 = (local_598->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (utxo == pUVar1) {
LAB_003ac3ab:
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_600._0_8_ = local_600 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_600,"Utxo is not found. VerifyInputSchnorrSignature fail.","");
        core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_600);
        __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      bVar3 = false;
      do {
        core::AbstractTxIn::GetTxid((Txid *)local_600,this_02);
        bVar2 = core::Txid::Equals((Txid *)local_600,&utxo->txid);
        if (bVar2) {
          uVar5 = core::AbstractTxIn::GetVout(this_02);
          uVar4 = utxo->vout;
          local_600._0_8_ = &PTR__Txid_00735400;
          if ((pointer)local_600._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_600._8_8_);
          }
          if (uVar5 == uVar4) {
            GetLockingScriptFromUtxoData((Script *)local_600,utxo);
            std::vector<cfd::core::TxOut,std::allocator<cfd::core::TxOut>>::
            emplace_back<cfd::core::Amount_const&,cfd::core::Script&>
                      ((vector<cfd::core::TxOut,std::allocator<cfd::core::TxOut>> *)&local_568,
                       &utxo->amount,(Script *)local_600);
            bVar3 = core::OutPoint::operator==(local_5c8,&local_590);
            if (bVar3) {
              UtxoData::operator=((UtxoData *)(local_52c + 0xc),utxo);
              core::Script::operator=(local_4d0,(Script *)local_600);
            }
            core::Script::~Script((Script *)local_600);
            bVar3 = true;
          }
        }
        else {
          local_600._0_8_ = &PTR__Txid_00735400;
          if ((pointer)local_600._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_600._8_8_);
          }
        }
        utxo = utxo + 1;
      } while (utxo != pUVar1);
      if (!bVar3) goto LAB_003ac3ab;
      local_590.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
      if (local_590.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_590.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      this_02 = this_02 + 1;
      annex = local_5a8;
    } while (this_02 != local_5a0);
  }
  bVar3 = core::Amount::operator==(local_2c8,0);
  this_01 = local_5b0;
  signature_00 = local_5b8;
  this_00 = local_5c0;
  if (bVar3) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_600._0_8_ = local_600 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_600,"OutPoint is not found into utxo_list.","");
    core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_600);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  bVar3 = core::Script::IsTaprootScript(local_4d0);
  if (bVar3) {
    core::Script::GetElementList
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               local_600,local_4d0);
    core::ScriptElement::GetBinaryData
              ((ByteData *)&local_590,(ScriptElement *)(local_600._0_8_ + 0x60));
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               local_600);
    core::SchnorrPubkey::GetData((ByteData *)local_600,this_01);
    bVar3 = core::ByteData::Equals((ByteData *)&local_590,(ByteData *)local_600);
    if ((pointer)local_600._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_600._0_8_);
    }
    if (bVar3) {
      uVar4 = (*(this_00->super_Transaction).super_AbstractTransaction._vptr_AbstractTransaction
                [0xf])(this_00,local_5c8);
      core::SchnorrSignature::GetSigHashType((SchnorrSignature *)local_52c);
      if (annex == (ByteData *)0x0) {
        core::ByteData::ByteData(&local_548);
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_548,&annex->data_
                  );
      }
      core::Transaction::GetSchnorrSignatureHash
                ((ByteData256 *)local_600,&this_00->super_Transaction,uVar4,(SigHashType *)local_52c
                 ,&local_568,(TapScriptData *)0x0,&local_548);
      if (local_548.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_548.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar3 = core::SchnorrPubkey::Verify(this_01,signature_00,(ByteData256 *)local_600);
      if ((pointer)local_600._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_600._0_8_);
      }
      if (local_590.txid_._vptr_Txid != (_func_int **)0x0) {
        operator_delete(local_590.txid_._vptr_Txid);
      }
      std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector(&local_568);
      UtxoData::~UtxoData((UtxoData *)(local_52c + 0xc));
      return bVar3;
    }
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_600._0_8_ = local_600 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_600,"Unmatch locking script.","");
    core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_600);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  local_600._0_8_ = local_600 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_600,"Target OutPoint is not taproot.","");
  core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_600);
  __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

bool TransactionContext::VerifyInputSchnorrSignature(
    const SchnorrSignature& signature, const OutPoint& outpoint,
    const std::vector<UtxoData>& utxo_list, const SchnorrPubkey& pubkey,
    const ByteData* annex) const {
  UtxoData target_utxo;
  std::vector<TxOut> utxos;
  utxos.reserve(vin_.size());
  for (const auto& txin_ref : vin_) {
    OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    bool is_find = false;
    for (const auto& utxo : utxo_list) {
      if (txin_ref.GetTxid().Equals(utxo.txid) &&
          (txin_ref.GetVout() == utxo.vout)) {
        is_find = true;
        Script locking_script = GetLockingScriptFromUtxoData(utxo);
        utxos.emplace_back(utxo.amount, locking_script);

        if (outpoint == target_outpoint) {
          target_utxo = utxo;
          target_utxo.locking_script = locking_script;
        }
      }
    }
    if (!is_find) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Utxo is not found. VerifyInputSchnorrSignature fail.");
    }
  }
  if (target_utxo.amount == 0) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "OutPoint is not found into utxo_list.");
  } else if (!target_utxo.locking_script.IsTaprootScript()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Target OutPoint is not taproot.");
  }
  auto hash = target_utxo.locking_script.GetElementList()[1].GetBinaryData();
  if (!hash.Equals(pubkey.GetData())) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch locking script.");
  }

  auto sighash = GetSchnorrSignatureHash(
      GetTxInIndex(outpoint), signature.GetSigHashType(), utxos, nullptr,
      (annex != nullptr) ? *annex : ByteData());
  return pubkey.Verify(signature, sighash);
}